

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver-opt.h
# Opt level: O3

void __thiscall
mp::InvalidOptionValue::InvalidOptionValue<int>
          (InvalidOptionValue *this,SolverOption *opt,int value,StringRef msg)

{
  StringRef name;
  StringRef msg_00;
  int in_stack_ffffffffffffffac;
  CStringRef in_stack_ffffffffffffffb0;
  size_t in_stack_ffffffffffffffb8;
  char *in_stack_ffffffffffffffc0;
  size_t in_stack_ffffffffffffffc8;
  
  strlen((opt->name_)._M_dataplus._M_p);
  name.size_ = in_stack_ffffffffffffffb8;
  name.data_ = in_stack_ffffffffffffffb0.data_;
  msg_00.size_ = in_stack_ffffffffffffffc8;
  msg_00.data_ = in_stack_ffffffffffffffc0;
  Format<int>(name,in_stack_ffffffffffffffac,msg_00);
  Error::Error((Error *)this,in_stack_ffffffffffffffb0,-1);
  *(undefined ***)&(this->super_OptionError).super_Error.super_RuntimeError =
       &PTR__SystemError_00288ab8;
  if (in_stack_ffffffffffffffb0.data_ != &stack0xffffffffffffffc0) {
    operator_delete(in_stack_ffffffffffffffb0.data_,(ulong)(in_stack_ffffffffffffffc0 + 1));
  }
  *(undefined ***)&(this->super_OptionError).super_Error.super_RuntimeError =
       &PTR__SystemError_00288f28;
  return;
}

Assistant:

InvalidOptionValue(const SolverOption &opt, T value, fmt::StringRef msg="")
    : OptionError(Format(opt.name(), value, msg)) {}